

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string local_478;
  undefined1 local_458 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
  local_438;
  _Alloc_hider local_400;
  char local_3f0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e0;
  _Alloc_hider local_3b8;
  char local_3a8 [912];
  
  bVar1 = embree::TutorialBenchmark::benchmark(argc,argv);
  if (bVar1) {
    embree::TutorialBenchmark::TutorialBenchmark
              ((TutorialBenchmark *)local_458,embree::renderBenchFunc<embree::Tutorial>);
    local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"hair_geometry","");
    iVar2 = embree::TutorialBenchmark::main((TutorialBenchmark *)local_458,argc,argv,&local_478);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    local_458._0_8_ = &PTR_postParseCommandLine_002c8fc8;
    if (local_3b8._M_p != local_3a8) {
      operator_delete(local_3b8._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3e0);
    if (local_400._M_p != local_3f0) {
      operator_delete(local_400._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
    ::~_Rb_tree(&local_438);
    std::
    vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
    ::~vector((vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
               *)(local_458 + 8));
  }
  else {
    embree::Tutorial::Tutorial((Tutorial *)local_458);
    iVar2 = embree::SceneLoadingTutorialApplication::main
                      ((SceneLoadingTutorialApplication *)local_458,argc,argv);
    embree::SceneLoadingTutorialApplication::~SceneLoadingTutorialApplication
              ((SceneLoadingTutorialApplication *)local_458);
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  if (embree::TutorialBenchmark::benchmark(argc, argv)) {
    return embree::TutorialBenchmark(embree::renderBenchFunc<embree::Tutorial>).main(argc, argv, "hair_geometry");
  }
  return embree::Tutorial().main(argc,argv);
}